

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkWriteParameters(ARKodeMem ark_mem,FILE *fp)

{
  double dVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (ark_mem == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkWriteParameters","arkode_mem = NULL illegal.")
    ;
    return -0x15;
  }
  fwrite("ARKode solver parameters:\n",0x1a,1,(FILE *)fp);
  if ((ark_mem->hmin != 0.0) || (NAN(ark_mem->hmin))) {
    fprintf((FILE *)fp,"  Minimum step size = %.16g\n");
  }
  dVar1 = ark_mem->hmax_inv;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    fprintf((FILE *)fp,"  Maximum step size = %.16g\n",1.0 / dVar1);
  }
  if (ark_mem->fixedstep != 0) {
    fwrite("  Fixed time-stepping enabled\n",0x1e,1,(FILE *)fp);
  }
  if (ark_mem->itol == 2) {
    pcVar3 = "  User provided error weight function\n";
    sVar2 = 0x26;
  }
  else {
    fprintf((FILE *)fp,"  Solver relative tolerance = %.16g\n",ark_mem->reltol);
    if (ark_mem->itol == 0) {
      fprintf((FILE *)fp,"  Solver absolute tolerance = %.16g\n",ark_mem->Sabstol);
      goto LAB_0040c664;
    }
    pcVar3 = "  Vector-valued solver absolute tolerance\n";
    sVar2 = 0x2a;
  }
  fwrite(pcVar3,sVar2,1,(FILE *)fp);
LAB_0040c664:
  if (ark_mem->rwt_is_ewt == 0) {
    if (ark_mem->ritol == 0) {
      fprintf((FILE *)fp,"  Absolute residual tolerance = %.16g\n",ark_mem->SRabstol);
    }
    else {
      if (ark_mem->ritol == 2) {
        pcVar3 = "  User provided residual weight function\n";
        sVar2 = 0x29;
      }
      else {
        pcVar3 = "  Vector-valued residual absolute tolerance\n";
        sVar2 = 0x2c;
      }
      fwrite(pcVar3,sVar2,1,(FILE *)fp);
    }
  }
  if ((ark_mem->hin != 0.0) || (NAN(ark_mem->hin))) {
    fprintf((FILE *)fp,"  Initial step size = %.16g\n");
  }
  fputc(10,(FILE *)fp);
  fprintf((FILE *)fp,"  Maximum step increase (first step) = %.16g\n",ark_mem->hadapt_mem->etamx1);
  fprintf((FILE *)fp,"  Step reduction factor on multiple error fails = %.16g\n",
          ark_mem->hadapt_mem->etamxf);
  fprintf((FILE *)fp,"  Minimum error fails before above factor is used = %i\n",
          (ulong)(uint)ark_mem->hadapt_mem->small_nef);
  fprintf((FILE *)fp,"  Step reduction factor on nonlinear convergence failure = %.16g\n",
          ark_mem->hadapt_mem->etacf);
  fprintf((FILE *)fp,"  Explicit safety factor = %.16g\n",ark_mem->hadapt_mem->cfl);
  if (ark_mem->hadapt_mem->HAdapt == (ARKAdaptFn)0x0) {
    fprintf((FILE *)fp,"  Time step adaptivity method %i\n",
            (ulong)(uint)ark_mem->hadapt_mem->imethod);
    fprintf((FILE *)fp,"     Safety factor = %.16g\n",ark_mem->hadapt_mem->safety);
    fprintf((FILE *)fp,"     Bias factor = %.16g\n",ark_mem->hadapt_mem->bias);
    fprintf((FILE *)fp,"     Growth factor = %.16g\n",ark_mem->hadapt_mem->growth);
    fprintf((FILE *)fp,"     Step growth lower bound = %.16g\n",ark_mem->hadapt_mem->lbound);
    fprintf((FILE *)fp,"     Step growth upper bound = %.16g\n",ark_mem->hadapt_mem->ubound);
    fprintf((FILE *)fp,"     k1 = %.16g\n",ark_mem->hadapt_mem->k1);
    fprintf((FILE *)fp,"     k2 = %.16g\n",ark_mem->hadapt_mem->k2);
    fprintf((FILE *)fp,"     k3 = %.16g\n",ark_mem->hadapt_mem->k3);
    if (ark_mem->hadapt_mem->expstab == arkExpStab) {
      pcVar3 = "  Default explicit stability function\n";
      sVar2 = 0x26;
    }
    else {
      pcVar3 = "  User provided explicit stability function\n";
      sVar2 = 0x2c;
    }
  }
  else {
    pcVar3 = "  User provided time step adaptivity function\n";
    sVar2 = 0x2e;
  }
  fwrite(pcVar3,sVar2,1,(FILE *)fp);
  fprintf((FILE *)fp,"  Maximum number of error test failures = %i\n",(ulong)(uint)ark_mem->maxnef);
  fprintf((FILE *)fp,"  Maximum number of convergence test failures = %i\n",
          (ulong)(uint)ark_mem->maxncf);
  return 0;
}

Assistant:

int arkWriteParameters(ARKodeMem ark_mem, FILE *fp)
{
  if (ark_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkWriteParameters", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }

  /* print integrator parameters to file */
  fprintf(fp, "ARKode solver parameters:\n");
  if (ark_mem->hmin != ZERO)
    fprintf(fp, "  Minimum step size = %" RSYM"\n",ark_mem->hmin);
  if (ark_mem->hmax_inv != ZERO)
    fprintf(fp, "  Maximum step size = %" RSYM"\n",ONE/ark_mem->hmax_inv);
  if (ark_mem->fixedstep)
    fprintf(fp, "  Fixed time-stepping enabled\n");
  if (ark_mem->itol == ARK_WF) {
    fprintf(fp, "  User provided error weight function\n");
  } else {
    fprintf(fp, "  Solver relative tolerance = %" RSYM"\n", ark_mem->reltol);
    if (ark_mem->itol == ARK_SS) {
      fprintf(fp, "  Solver absolute tolerance = %" RSYM"\n", ark_mem->Sabstol);
    } else {
      fprintf(fp, "  Vector-valued solver absolute tolerance\n");
    }
  }
  if (!ark_mem->rwt_is_ewt) {
    if (ark_mem->ritol == ARK_WF) {
      fprintf(fp, "  User provided residual weight function\n");
    } else {
      if (ark_mem->ritol == ARK_SS) {
        fprintf(fp, "  Absolute residual tolerance = %" RSYM"\n", ark_mem->SRabstol);
      } else {
        fprintf(fp, "  Vector-valued residual absolute tolerance\n");
      }
    }
  }
  if (ark_mem->hin != ZERO)
    fprintf(fp, "  Initial step size = %" RSYM"\n",ark_mem->hin);
  fprintf(fp, "\n");
  fprintf(fp, "  Maximum step increase (first step) = %"RSYM"\n",
          ark_mem->hadapt_mem->etamx1);
  fprintf(fp, "  Step reduction factor on multiple error fails = %"RSYM"\n",
          ark_mem->hadapt_mem->etamxf);
  fprintf(fp, "  Minimum error fails before above factor is used = %i\n",
          ark_mem->hadapt_mem->small_nef);
  fprintf(fp, "  Step reduction factor on nonlinear convergence failure = %"RSYM"\n",
          ark_mem->hadapt_mem->etacf);
  fprintf(fp, "  Explicit safety factor = %"RSYM"\n",
          ark_mem->hadapt_mem->cfl);
  if (ark_mem->hadapt_mem->HAdapt == NULL) {
    fprintf(fp, "  Time step adaptivity method %i\n", ark_mem->hadapt_mem->imethod);
    fprintf(fp, "     Safety factor = %"RSYM"\n", ark_mem->hadapt_mem->safety);
    fprintf(fp, "     Bias factor = %"RSYM"\n", ark_mem->hadapt_mem->bias);
    fprintf(fp, "     Growth factor = %"RSYM"\n", ark_mem->hadapt_mem->growth);
    fprintf(fp, "     Step growth lower bound = %"RSYM"\n", ark_mem->hadapt_mem->lbound);
    fprintf(fp, "     Step growth upper bound = %"RSYM"\n", ark_mem->hadapt_mem->ubound);
    fprintf(fp, "     k1 = %"RSYM"\n", ark_mem->hadapt_mem->k1);
    fprintf(fp, "     k2 = %"RSYM"\n", ark_mem->hadapt_mem->k2);
    fprintf(fp, "     k3 = %"RSYM"\n", ark_mem->hadapt_mem->k3);
    if (ark_mem->hadapt_mem->expstab == arkExpStab) {
      fprintf(fp, "  Default explicit stability function\n");
    } else {
      fprintf(fp, "  User provided explicit stability function\n");
    }
  } else {
    fprintf(fp, "  User provided time step adaptivity function\n");
  }

  fprintf(fp, "  Maximum number of error test failures = %i\n",ark_mem->maxnef);
  fprintf(fp, "  Maximum number of convergence test failures = %i\n",ark_mem->maxncf);

  return(ARK_SUCCESS);
}